

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

QByteArray * QtDebugUtils::toPrintable(char *data,qint64 len,qsizetype maxSize)

{
  char cVar1;
  int iVar2;
  longlong *plVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char c;
  qsizetype i;
  QByteArray *out;
  char buf [5];
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  QByteArray *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  byte bVar5;
  undefined4 in_stack_ffffffffffffffb4;
  long local_40;
  long local_20;
  long local_18;
  undefined4 local_10;
  undefined1 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    QByteArray::QByteArray
              ((QByteArray *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (char *)in_RDI,(qsizetype)in_RDI);
  }
  else {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = in_RCX;
    local_18 = in_RDX;
    QByteArray::QByteArray((QByteArray *)0x277221);
    for (local_40 = 0; plVar3 = qMin<long_long>(&local_18,&local_20), local_40 < *plVar3;
        local_40 = local_40 + 1) {
      uVar4 = (uint)*(byte *)(in_RSI + local_40) << 0x18;
      iVar2 = QtMiscUtils::isAsciiPrintable((int)(char)*(byte *)(in_RSI + local_40));
      if (iVar2 == 0) {
        bVar5 = (byte)(uVar4 >> 0x18);
        if (bVar5 == 9) {
          QByteArray::operator+=
                    (in_stack_ffffffffffffff80,
                     (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        }
        else if (bVar5 == 10) {
          QByteArray::operator+=
                    (in_stack_ffffffffffffff80,
                     (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        }
        else if (bVar5 == 0xd) {
          QByteArray::operator+=
                    (in_stack_ffffffffffffff80,
                     (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        }
        else {
          local_c = 0xaa;
          local_10 = 0xaaaa785c;
          cVar1 = QtMiscUtils::toHexLower((uint)(bVar5 >> 4));
          local_10._0_3_ = CONCAT12(cVar1,(undefined2)local_10);
          cVar1 = QtMiscUtils::toHexLower(uVar4 >> 0x18 & 0xf);
          local_10 = CONCAT13(cVar1,(undefined3)local_10);
          local_c = 0;
          QByteArray::operator+=
                    (in_stack_ffffffffffffff80,
                     (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        }
      }
      else {
        QByteArray::operator+=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      }
    }
    if (local_20 < local_18) {
      QByteArray::operator+=
                (in_stack_ffffffffffffff80,
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QtDebugUtils::toPrintable(const char *data, qint64 len, qsizetype maxSize)
{
    if (!data)
        return "(null)";

    QByteArray out;
    for (qsizetype i = 0; i < qMin(len, maxSize); ++i) {
        char c = data[i];
        if (isAsciiPrintable(c)) {
            out += c;
        } else {
            switch (c) {
            case '\n':
                out += "\\n";
                break;
            case '\r':
                out += "\\r";
                break;
            case '\t':
                out += "\\t";
                break;
            default: {
                const char buf[] = {
                    '\\',
                    'x',
                    toHexLower(uchar(c) / 16),
                    toHexLower(uchar(c) % 16),
                    0
                };
                out += buf;
            }
            }
        }
    }

    if (maxSize < len)
        out += "...";

    return out;
}